

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata.cc
# Opt level: O2

void __thiscall Funcdata::warning(Funcdata *this,string *txt,Address *ad)

{
  CommentDatabase *pCVar1;
  string msg;
  
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&msg);
  std::__cxx11::string::append((string *)&msg);
  pCVar1 = this->glb->commentdb;
  (*pCVar1->_vptr_CommentDatabase[5])(pCVar1,0x10,&this->baseaddr,ad,&msg);
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void Funcdata::warning(const string &txt,const Address &ad) const

{
  string msg;
  if ((flags & jumptablerecovery_on)!=0)
    msg = "WARNING (jumptable): ";
  else
    msg = "WARNING: ";
  msg += txt;
  glb->commentdb->addCommentNoDuplicate(Comment::warning,baseaddr,ad,msg);
}